

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_ssse3_intr.c
# Opt level: O3

void ihevc_deblk_luma_horz_ssse3
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 bs,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 beta_offset_div2,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [14];
  unkbyte10 Var8;
  unkuint10 Var9;
  undefined1 auVar10 [14];
  unkbyte10 Var11;
  unkbyte10 Var12;
  ulong uVar13;
  ulong *puVar14;
  ulong *puVar15;
  int iVar16;
  ulong *puVar17;
  UWORD8 *pUVar18;
  int iVar19;
  bool bVar20;
  uint uVar21;
  bool bVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar38;
  undefined2 uVar62;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  undefined1 auVar40 [16];
  undefined1 auVar47 [16];
  byte bVar68;
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 uVar71;
  undefined1 uVar72;
  undefined1 uVar73;
  undefined1 uVar74;
  undefined1 uVar75;
  undefined1 uVar76;
  undefined1 uVar77;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  short sVar78;
  undefined8 uVar79;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  undefined1 auVar80 [16];
  short sVar87;
  undefined1 uVar88;
  short sVar89;
  undefined1 uVar95;
  short sVar96;
  byte bVar98;
  short sVar99;
  byte bVar101;
  short sVar102;
  short sVar104;
  short sVar105;
  short sVar106;
  undefined1 auVar90 [16];
  undefined1 uVar94;
  undefined1 uVar97;
  byte bVar100;
  byte bVar103;
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  short sVar107;
  byte bVar108;
  byte bVar126;
  undefined1 auVar109 [12];
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar122;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  byte bVar130;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar131 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  short sVar145;
  short sVar146;
  short sVar168;
  short sVar169;
  short sVar172;
  short sVar173;
  short sVar176;
  short sVar177;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  undefined1 auVar147 [16];
  undefined1 auVar156 [16];
  undefined1 auVar165 [16];
  short sVar185;
  short sVar186;
  int iVar187;
  int iVar192;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined2 uVar249;
  ushort uVar194;
  ushort uVar209;
  ushort uVar210;
  ushort uVar211;
  ushort uVar212;
  ushort uVar213;
  ushort uVar214;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  ushort uVar215;
  undefined1 auVar208 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar226 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar30 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar39 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 uVar56;
  undefined1 uVar57;
  undefined1 uVar58;
  undefined1 uVar59;
  undefined1 uVar60;
  undefined1 uVar61;
  undefined1 uVar63;
  undefined1 auVar92 [16];
  undefined1 auVar112 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 uVar142;
  undefined1 uVar143;
  undefined1 uVar144;
  undefined1 auVar148 [16];
  undefined1 auVar157 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 uVar166;
  undefined1 uVar167;
  undefined1 uVar170;
  undefined1 uVar171;
  undefined1 uVar174;
  undefined1 uVar175;
  undefined1 uVar178;
  undefined2 uVar193;
  undefined1 auVar205 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar195 [16];
  undefined1 auVar218 [16];
  undefined1 auVar227 [16];
  undefined1 auVar237 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  
  if (bs < 1) {
    __assert_fail("((bs > 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_deblk_ssse3_intr.c"
                  ,0x235,
                  "void ihevc_deblk_luma_horz_ssse3(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if (filter_flag_q != 0 || filter_flag_p != 0) {
    iVar16 = quant_param_p + quant_param_q + 1 >> 1;
    uVar21 = iVar16 + beta_offset_div2 * 2;
    if ((int)uVar21 < 1) {
      uVar21 = 0;
    }
    uVar25 = 0x33;
    if ((int)uVar21 < 0x33) {
      uVar25 = (ulong)uVar21;
    }
    uVar21 = (bs & 0x7ffffffeU) + iVar16 + tc_offset_div2 * 2;
    uVar23 = 0;
    if (0 < (int)uVar21) {
      uVar23 = uVar21;
    }
    uVar13 = 0x35;
    if ((int)uVar23 < 0x35) {
      uVar13 = (ulong)uVar23;
    }
    iVar16 = gai4_ihevc_tc_table[uVar13];
    if (iVar16 != 0) {
      uVar13 = *(ulong *)pu1_src;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar13;
      lVar24 = (long)src_strd;
      uVar1 = *(ulong *)(pu1_src + lVar24);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar1;
      puVar14 = (ulong *)(pu1_src + -lVar24);
      uVar2 = *puVar14;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar2;
      puVar17 = (ulong *)(pu1_src + lVar24 * -2);
      uVar3 = *puVar17;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar3;
      uVar4 = *(ulong *)(pu1_src + lVar24 * 2);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = uVar4;
      uVar26 = *(undefined8 *)(pu1_src + lVar24 * 3);
      uVar5 = *(ulong *)(pu1_src + lVar24 * -3);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar5;
      uVar6 = *(ulong *)(pu1_src + -(long)(src_strd * 4));
      uVar37 = (undefined1)(uVar2 >> 0x38);
      uVar63 = (undefined1)(uVar3 >> 0x38);
      auVar248._8_6_ = 0;
      auVar248._0_8_ = uVar3;
      auVar248[0xe] = uVar63;
      auVar248[0xf] = uVar37;
      uVar36 = (undefined1)(uVar2 >> 0x30);
      auVar46._14_2_ = auVar248._14_2_;
      auVar46._8_5_ = 0;
      auVar46._0_8_ = uVar3;
      auVar46[0xd] = uVar36;
      uVar61 = (undefined1)(uVar3 >> 0x30);
      auVar246._13_3_ = auVar46._13_3_;
      auVar246._8_4_ = 0;
      auVar246._0_8_ = uVar3;
      auVar246[0xc] = uVar61;
      uVar35 = (undefined1)(uVar2 >> 0x28);
      auVar45._12_4_ = auVar246._12_4_;
      auVar45._8_3_ = 0;
      auVar45._0_8_ = uVar3;
      auVar45[0xb] = uVar35;
      uVar60 = (undefined1)(uVar3 >> 0x28);
      auVar44._11_5_ = auVar45._11_5_;
      auVar44._8_2_ = 0;
      auVar44._0_8_ = uVar3;
      auVar44[10] = uVar60;
      uVar34 = (undefined1)(uVar2 >> 0x20);
      auVar43._10_6_ = auVar44._10_6_;
      auVar43[8] = 0;
      auVar43._0_8_ = uVar3;
      auVar43[9] = uVar34;
      uVar59 = (undefined1)(uVar3 >> 0x20);
      auVar42._9_7_ = auVar43._9_7_;
      auVar42[8] = uVar59;
      auVar42._0_8_ = uVar3;
      uVar33 = (undefined1)(uVar2 >> 0x18);
      uVar58 = (undefined1)(uVar3 >> 0x18);
      Var8 = CONCAT91(CONCAT81(auVar42._8_8_,uVar33),uVar58);
      uVar32 = (undefined1)(uVar2 >> 0x10);
      auVar41._6_10_ = Var8;
      auVar41[5] = uVar32;
      uVar57 = (undefined1)(uVar3 >> 0x10);
      auVar41._0_4_ = (undefined4)uVar3;
      auVar41[4] = uVar57;
      uVar31 = (undefined1)(uVar2 >> 8);
      auVar7._2_12_ = auVar41._4_12_;
      auVar7[1] = uVar31;
      uVar56 = (undefined1)(uVar3 >> 8);
      auVar7[0] = uVar56;
      auVar40._0_2_ = CONCAT11((char)uVar2,(char)uVar3);
      auVar40._2_14_ = auVar7;
      bVar103 = (byte)(uVar5 >> 0x38);
      auVar202._8_6_ = 0;
      auVar202._0_8_ = uVar6;
      auVar202[0xe] = (char)(uVar6 >> 0x38);
      auVar202[0xf] = bVar103;
      bVar101 = (byte)(uVar5 >> 0x30);
      auVar201._14_2_ = auVar202._14_2_;
      auVar201._8_5_ = 0;
      auVar201._0_8_ = uVar6;
      auVar201[0xd] = bVar101;
      auVar200._13_3_ = auVar201._13_3_;
      auVar200._8_4_ = 0;
      auVar200._0_8_ = uVar6;
      auVar200[0xc] = (char)(uVar6 >> 0x30);
      bVar100 = (byte)(uVar5 >> 0x28);
      auVar199._12_4_ = auVar200._12_4_;
      auVar199._8_3_ = 0;
      auVar199._0_8_ = uVar6;
      auVar199[0xb] = bVar100;
      auVar198._11_5_ = auVar199._11_5_;
      auVar198._8_2_ = 0;
      auVar198._0_8_ = uVar6;
      auVar198[10] = (char)(uVar6 >> 0x28);
      bVar98 = (byte)(uVar5 >> 0x20);
      auVar197._10_6_ = auVar198._10_6_;
      auVar197[8] = 0;
      auVar197._0_8_ = uVar6;
      auVar197[9] = bVar98;
      auVar196._9_7_ = auVar197._9_7_;
      auVar196[8] = (char)(uVar6 >> 0x20);
      auVar196._0_8_ = uVar6;
      uVar97 = (undefined1)(uVar5 >> 0x18);
      Var9 = CONCAT91(CONCAT81(auVar196._8_8_,uVar97),(char)(uVar6 >> 0x18));
      uVar95 = (undefined1)(uVar5 >> 0x10);
      auVar140._10_6_ = 0;
      auVar140._0_10_ = Var9;
      auVar206._11_5_ = 0;
      auVar206._0_11_ = SUB1611(auVar140 << 0x30,5);
      uVar94 = (undefined1)(uVar5 >> 8);
      auVar216._12_4_ = 0;
      auVar216._0_12_ = SUB1612(auVar206 << 0x28,4);
      auVar189._13_3_ = 0;
      auVar189._0_13_ = SUB1613(auVar216 << 0x20,3);
      uVar88 = (undefined1)uVar5;
      auVar195._2_14_ = SUB1614(auVar189 << 0x18,2);
      uVar249 = CONCAT11(uVar88,(char)uVar6);
      uVar77 = (undefined1)(uVar1 >> 0x38);
      uVar178 = (undefined1)(uVar13 >> 0x38);
      auVar155._8_6_ = 0;
      auVar155._0_8_ = uVar13;
      auVar155[0xe] = uVar178;
      auVar155[0xf] = uVar77;
      uVar76 = (undefined1)(uVar1 >> 0x30);
      auVar154._14_2_ = auVar155._14_2_;
      auVar154._8_5_ = 0;
      auVar154._0_8_ = uVar13;
      auVar154[0xd] = uVar76;
      uVar175 = (undefined1)(uVar13 >> 0x30);
      auVar153._13_3_ = auVar154._13_3_;
      auVar153._8_4_ = 0;
      auVar153._0_8_ = uVar13;
      auVar153[0xc] = uVar175;
      uVar75 = (undefined1)(uVar1 >> 0x28);
      auVar152._12_4_ = auVar153._12_4_;
      auVar152._8_3_ = 0;
      auVar152._0_8_ = uVar13;
      auVar152[0xb] = uVar75;
      uVar174 = (undefined1)(uVar13 >> 0x28);
      auVar151._11_5_ = auVar152._11_5_;
      auVar151._8_2_ = 0;
      auVar151._0_8_ = uVar13;
      auVar151[10] = uVar174;
      uVar74 = (undefined1)(uVar1 >> 0x20);
      auVar150._10_6_ = auVar151._10_6_;
      auVar150[8] = 0;
      auVar150._0_8_ = uVar13;
      auVar150[9] = uVar74;
      uVar171 = (undefined1)(uVar13 >> 0x20);
      auVar149._9_7_ = auVar150._9_7_;
      auVar149[8] = uVar171;
      auVar149._0_8_ = uVar13;
      uVar73 = (undefined1)(uVar1 >> 0x18);
      uVar170 = (undefined1)(uVar13 >> 0x18);
      Var11 = CONCAT91(CONCAT81(auVar149._8_8_,uVar73),uVar170);
      uVar72 = (undefined1)(uVar1 >> 0x10);
      auVar148._6_10_ = Var11;
      auVar148[5] = uVar72;
      uVar167 = (undefined1)(uVar13 >> 0x10);
      auVar148._0_4_ = (undefined4)uVar13;
      auVar148[4] = uVar167;
      uVar71 = (undefined1)(uVar1 >> 8);
      auVar10._2_12_ = auVar148._4_12_;
      auVar10[1] = uVar71;
      uVar166 = (undefined1)(uVar13 >> 8);
      auVar10[0] = uVar166;
      auVar147._0_2_ = CONCAT11((char)uVar1,(char)uVar13);
      auVar147._2_14_ = auVar10;
      bVar68 = (byte)(uVar4 >> 0x38);
      auVar139._8_6_ = 0;
      auVar139._0_8_ = uVar4;
      auVar139[0xe] = bVar68;
      auVar139[0xf] = (char)((ulong)uVar26 >> 0x38);
      auVar138._14_2_ = auVar139._14_2_;
      auVar138._8_5_ = 0;
      auVar138._0_8_ = uVar4;
      auVar138[0xd] = (char)((ulong)uVar26 >> 0x30);
      bVar67 = (byte)(uVar4 >> 0x30);
      auVar137._13_3_ = auVar138._13_3_;
      auVar137._8_4_ = 0;
      auVar137._0_8_ = uVar4;
      auVar137[0xc] = bVar67;
      auVar136._12_4_ = auVar137._12_4_;
      auVar136._8_3_ = 0;
      auVar136._0_8_ = uVar4;
      auVar136[0xb] = (char)((ulong)uVar26 >> 0x28);
      bVar66 = (byte)(uVar4 >> 0x28);
      auVar135._11_5_ = auVar136._11_5_;
      auVar135._8_2_ = 0;
      auVar135._0_8_ = uVar4;
      auVar135[10] = bVar66;
      auVar134._10_6_ = auVar135._10_6_;
      auVar134[8] = 0;
      auVar134._0_8_ = uVar4;
      auVar134[9] = (char)((ulong)uVar26 >> 0x20);
      bVar65 = (byte)(uVar4 >> 0x20);
      auVar133._9_7_ = auVar134._9_7_;
      auVar133[8] = bVar65;
      auVar133._0_8_ = uVar4;
      uVar144 = (undefined1)(uVar4 >> 0x18);
      Var12 = CONCAT91(CONCAT81(auVar133._8_8_,(char)((ulong)uVar26 >> 0x18)),uVar144);
      auVar132._6_10_ = Var12;
      auVar132[5] = (char)((ulong)uVar26 >> 0x10);
      uVar143 = (undefined1)(uVar4 >> 0x10);
      auVar132._0_4_ = (undefined4)uVar4;
      auVar132[4] = uVar143;
      auVar131._4_12_ = auVar132._4_12_;
      auVar131[3] = (char)((ulong)uVar26 >> 8);
      uVar142 = (undefined1)(uVar4 >> 8);
      auVar131[2] = uVar142;
      auVar131._0_2_ = CONCAT11((char)uVar26,(char)uVar4);
      uVar62 = (undefined2)Var8;
      auVar203._0_12_ = auVar195._0_12_;
      auVar203._12_2_ = (short)Var9;
      auVar203._14_2_ = uVar62;
      auVar204._0_4_ = CONCAT22(auVar40._0_2_,uVar249);
      uVar193 = (undefined2)Var11;
      auVar188._0_12_ = auVar147._0_12_;
      auVar188._12_2_ = uVar193;
      auVar188._14_2_ = (short)Var12;
      auVar204._6_2_ = auVar131._0_2_;
      auVar204._4_2_ = auVar147._0_2_;
      auVar205._4_4_ = auVar203._12_4_;
      auVar205._0_4_ = auVar204._0_4_;
      auVar205._8_4_ = auVar203._12_4_;
      auVar205._12_4_ = auVar188._12_4_;
      auVar204._8_8_ = auVar205._8_8_;
      auVar189 = pmaddubsw(auVar204,(undefined1  [16])coef_d);
      iVar19 = gai4_ihevc_beta_table[uVar25];
      auVar216 = pmovsxbw(in_XMM11,0x101010101010101);
      auVar189 = pmaddwd(auVar189,auVar216);
      auVar189 = pabsd(auVar189,auVar189);
      iVar187 = auVar189._4_4_ + auVar189._0_4_;
      iVar192 = auVar189._8_4_ + auVar189._12_4_;
      if (iVar192 + iVar187 < iVar19) {
        auVar206 = pshufb(auVar204,(undefined1  [16])shuffle_d);
        auVar206 = pmaddubsw(auVar206,_DAT_00174520);
        auVar206 = pabsw(auVar206,auVar206);
        auVar216 = pmaddwd(auVar206,auVar216);
        bVar20 = false;
        if ((iVar187 * 2 < iVar19 >> 2) && (auVar216._8_4_ < iVar19 >> 3)) {
          bVar20 = auVar216._0_4_ < iVar16 * 5 + 1 >> 1;
        }
        bVar22 = false;
        if ((iVar192 * 2 < iVar19 >> 2) && (bVar22 = false, auVar216._12_4_ < iVar19 >> 3)) {
          bVar22 = auVar216._4_4_ < iVar16 * 5 + 1 >> 1;
        }
        auVar47._0_8_ = auVar40._0_8_;
        if ((bool)(bVar22 & bVar20)) {
          uVar26 = *(undefined8 *)(pu1_src + -(long)(src_strd * 4));
          auVar47._8_8_ = auVar147._0_8_;
          auVar189 = pmaddubsw(auVar47,_DAT_00174530);
          auVar225._8_6_ = 0;
          auVar225._0_8_ = uVar1;
          auVar225[0xe] = uVar77;
          auVar225[0xf] = bVar68;
          auVar224._14_2_ = auVar225._14_2_;
          auVar224._8_5_ = 0;
          auVar224._0_8_ = uVar1;
          auVar224[0xd] = bVar67;
          auVar223._13_3_ = auVar224._13_3_;
          auVar223._8_4_ = 0;
          auVar223._0_8_ = uVar1;
          auVar223[0xc] = uVar76;
          auVar222._12_4_ = auVar223._12_4_;
          auVar222._8_3_ = 0;
          auVar222._0_8_ = uVar1;
          auVar222[0xb] = bVar66;
          auVar221._11_5_ = auVar222._11_5_;
          auVar221._8_2_ = 0;
          auVar221._0_8_ = uVar1;
          auVar221[10] = uVar75;
          auVar220._10_6_ = auVar221._10_6_;
          auVar220[8] = 0;
          auVar220._0_8_ = uVar1;
          auVar220[9] = bVar65;
          auVar219._9_7_ = auVar220._9_7_;
          auVar219[8] = uVar74;
          auVar219._0_8_ = uVar1;
          auVar218._8_8_ = auVar219._8_8_;
          auVar218[7] = uVar144;
          auVar218[6] = uVar73;
          auVar218[5] = uVar143;
          auVar218._0_4_ = (undefined4)uVar1;
          auVar218[4] = uVar72;
          auVar217._4_12_ = auVar218._4_12_;
          auVar217[3] = uVar142;
          auVar217[2] = uVar71;
          auVar217[1] = (char)uVar4;
          auVar217[0] = (char)uVar1;
          auVar164._8_6_ = 0;
          auVar164._0_8_ = uVar3;
          auVar164[0xe] = uVar63;
          auVar164[0xf] = bVar103;
          auVar163._14_2_ = auVar164._14_2_;
          auVar163._8_5_ = 0;
          auVar163._0_8_ = uVar3;
          auVar163[0xd] = bVar101;
          auVar162._13_3_ = auVar163._13_3_;
          auVar162._8_4_ = 0;
          auVar162._0_8_ = uVar3;
          auVar162[0xc] = uVar61;
          auVar161._12_4_ = auVar162._12_4_;
          auVar161._8_3_ = 0;
          auVar161._0_8_ = uVar3;
          auVar161[0xb] = bVar100;
          auVar160._11_5_ = auVar161._11_5_;
          auVar160._8_2_ = 0;
          auVar160._0_8_ = uVar3;
          auVar160[10] = uVar60;
          auVar159._10_6_ = auVar160._10_6_;
          auVar159[8] = 0;
          auVar159._0_8_ = uVar3;
          auVar159[9] = bVar98;
          auVar158._9_7_ = auVar159._9_7_;
          auVar158[8] = uVar59;
          auVar158._0_8_ = uVar3;
          auVar157._8_8_ = auVar158._8_8_;
          auVar157[7] = uVar97;
          auVar157[6] = uVar58;
          auVar157[5] = uVar95;
          auVar157[4] = uVar57;
          auVar157._0_4_ = auVar41._0_4_;
          auVar156._4_12_ = auVar157._4_12_;
          auVar156[3] = uVar94;
          auVar156[2] = uVar56;
          auVar156[1] = uVar88;
          auVar156[0] = (char)uVar3;
          auVar165._0_8_ = auVar156._0_8_;
          auVar165._8_8_ = auVar217._0_8_;
          auVar234._8_6_ = 0;
          auVar234._0_8_ = uVar2;
          auVar234[0xe] = uVar37;
          auVar234[0xf] = uVar178;
          auVar233._14_2_ = auVar234._14_2_;
          auVar233._8_5_ = 0;
          auVar233._0_8_ = uVar2;
          auVar233[0xd] = uVar175;
          auVar232._13_3_ = auVar233._13_3_;
          auVar232._8_4_ = 0;
          auVar232._0_8_ = uVar2;
          auVar232[0xc] = uVar36;
          auVar231._12_4_ = auVar232._12_4_;
          auVar231._8_3_ = 0;
          auVar231._0_8_ = uVar2;
          auVar231[0xb] = uVar174;
          auVar230._11_5_ = auVar231._11_5_;
          auVar230._8_2_ = 0;
          auVar230._0_8_ = uVar2;
          auVar230[10] = uVar35;
          auVar229._10_6_ = auVar230._10_6_;
          auVar229[8] = 0;
          auVar229._0_8_ = uVar2;
          auVar229[9] = uVar171;
          auVar228._9_7_ = auVar229._9_7_;
          auVar228[8] = uVar34;
          auVar228._0_8_ = uVar2;
          auVar227._8_8_ = auVar228._8_8_;
          auVar227[7] = uVar170;
          auVar227[6] = uVar33;
          auVar227[5] = uVar167;
          auVar227._0_4_ = (undefined4)uVar2;
          auVar227[4] = uVar32;
          auVar226._4_12_ = auVar227._4_12_;
          auVar226[3] = uVar166;
          auVar226[2] = uVar31;
          auVar226[1] = (char)uVar13;
          auVar226[0] = (char)uVar2;
          auVar235._0_4_ = auVar226._0_4_;
          auVar235._4_4_ = auVar227._4_4_;
          auVar235._8_4_ = auVar235._0_4_;
          auVar235._12_4_ = auVar235._4_4_;
          auVar206 = pmaddubsw(auVar235,_DAT_00174530);
          auVar216 = pmaddubsw(auVar165,_DAT_00174530);
          sVar145 = auVar216._0_2_ + auVar206._0_2_;
          sVar168 = auVar216._2_2_ + auVar206._2_2_;
          sVar172 = auVar216._4_2_ + auVar206._4_2_;
          sVar176 = auVar216._6_2_ + auVar206._6_2_;
          sVar179 = auVar216._8_2_ + auVar206._8_2_;
          sVar181 = auVar216._10_2_ + auVar206._10_2_;
          sVar183 = auVar216._12_2_ + auVar206._12_2_;
          sVar185 = auVar216._14_2_ + auVar206._14_2_;
          auVar216 = pshufb(ZEXT416((uint)(iVar16 * 2)),(undefined1  [16])0x0);
          auVar30._8_4_ = (int)(uVar2 >> 0x20);
          auVar30._0_8_ = uVar2;
          auVar30._12_4_ = (int)(uVar13 >> 0x20);
          auVar29._8_8_ = auVar30._8_8_;
          auVar29._0_8_ = CONCAT44(auVar148._0_4_,auVar227._0_4_);
          auVar70._12_4_ = auVar218._0_4_;
          auVar70._8_4_ = auVar41._0_4_;
          auVar70._0_8_ = auVar29._0_8_;
          auVar207._0_4_ = (int)((long)filter_flag_p << 0x1f) >> 0x1f;
          auVar207._4_4_ =
               (int)((uint)((ulong)((long)filter_flag_p << 0x1f) >> 0x20) |
                    (uint)(((ulong)(uint)filter_flag_q << 0x3f) >> 0x20)) >> 0x1f;
          auVar207._8_4_ = auVar207._0_4_;
          auVar207._12_4_ = auVar207._4_4_;
          auVar207 = auVar207 & auVar216;
          auVar206 = paddusb(auVar70,auVar207);
          auVar216 = psubusb(auVar70,auVar207);
          auVar244._8_6_ = 0;
          auVar244._0_8_ = uVar5;
          auVar244[0xe] = bVar103;
          auVar244[0xf] = (char)((ulong)uVar26 >> 0x38);
          auVar243._14_2_ = auVar244._14_2_;
          auVar243._8_5_ = 0;
          auVar243._0_8_ = uVar5;
          auVar243[0xd] = (char)((ulong)uVar26 >> 0x30);
          auVar242._13_3_ = auVar243._13_3_;
          auVar242._8_4_ = 0;
          auVar242._0_8_ = uVar5;
          auVar242[0xc] = bVar101;
          auVar241._12_4_ = auVar242._12_4_;
          auVar241._8_3_ = 0;
          auVar241._0_8_ = uVar5;
          auVar241[0xb] = (char)((ulong)uVar26 >> 0x28);
          auVar240._11_5_ = auVar241._11_5_;
          auVar240._8_2_ = 0;
          auVar240._0_8_ = uVar5;
          auVar240[10] = bVar100;
          auVar239._10_6_ = auVar240._10_6_;
          auVar239[8] = 0;
          auVar239._0_8_ = uVar5;
          auVar239[9] = (char)((ulong)uVar26 >> 0x20);
          auVar238._9_7_ = auVar239._9_7_;
          auVar238[8] = bVar98;
          auVar238._0_8_ = uVar5;
          auVar237._8_8_ = auVar238._8_8_;
          auVar237[7] = (char)((ulong)uVar26 >> 0x18);
          auVar237[6] = uVar97;
          auVar237[5] = (char)((ulong)uVar26 >> 0x10);
          auVar237._0_4_ = (undefined4)uVar5;
          auVar237[4] = uVar95;
          auVar236._4_12_ = auVar237._4_12_;
          auVar236[3] = (char)((ulong)uVar26 >> 8);
          auVar236[2] = uVar94;
          auVar236[1] = (char)uVar26;
          auVar236[0] = uVar88;
          auVar245._0_8_ = auVar236._0_8_;
          auVar245._8_8_ = auVar131._0_8_;
          auVar246 = pmaddubsw(auVar245,_DAT_00174430);
          auVar92._8_4_ = (int)(uVar5 >> 0x20);
          auVar92._0_8_ = uVar5;
          auVar92._12_4_ = (int)(uVar4 >> 0x20);
          auVar91._8_8_ = auVar92._8_8_;
          auVar91._4_4_ = auVar132._0_4_;
          auVar91._0_4_ = auVar237._0_4_;
          auVar140 = paddusb(auVar91,auVar207);
          auVar27 = psubusb(auVar91,auVar207);
          auVar28 = pmovsxbw(auVar207,0x202020202020202);
          sVar146 = sVar145 + 4;
          sVar169 = sVar168 + 4;
          sVar173 = sVar172 + 4;
          sVar177 = sVar176 + 4;
          sVar180 = sVar179 + 4;
          sVar182 = sVar181 + 4;
          sVar184 = sVar183 + 4;
          sVar186 = sVar185 + 4;
          auVar111._0_2_ = auVar189._8_2_ + auVar189._0_2_ + sVar146;
          auVar111._2_2_ = auVar189._10_2_ + auVar189._2_2_ + sVar169;
          auVar111._4_2_ = auVar189._12_2_ + auVar189._4_2_ + sVar173;
          auVar111._6_2_ = auVar189._14_2_ + auVar189._6_2_ + sVar177;
          auVar111._8_2_ = auVar189._0_2_ + auVar189._8_2_ + sVar180;
          auVar111._10_2_ = auVar189._2_2_ + auVar189._10_2_ + sVar182;
          auVar111._12_2_ = auVar189._4_2_ + auVar189._12_2_ + sVar184;
          auVar111._14_2_ = auVar189._6_2_ + auVar189._14_2_ + sVar186;
          auVar189 = psraw(auVar111,3);
          uVar194 = (ushort)(auVar28._0_2_ + sVar145) >> 2;
          uVar209 = (ushort)(auVar28._2_2_ + sVar168) >> 2;
          uVar210 = (ushort)(auVar28._4_2_ + sVar172) >> 2;
          uVar211 = (ushort)(auVar28._6_2_ + sVar176) >> 2;
          uVar212 = (ushort)(auVar28._8_2_ + sVar179) >> 2;
          uVar213 = (ushort)(auVar28._10_2_ + sVar181) >> 2;
          uVar214 = (ushort)(auVar28._12_2_ + sVar183) >> 2;
          uVar215 = (ushort)(auVar28._14_2_ + sVar185) >> 2;
          sVar145 = auVar189._0_2_;
          bVar116 = (0 < sVar145) * (sVar145 < 0x100) * auVar189[0] - (0xff < sVar145);
          sVar145 = auVar189._2_2_;
          bVar64 = (0 < sVar145) * (sVar145 < 0x100) * auVar189[2] - (0xff < sVar145);
          sVar145 = auVar189._4_2_;
          bVar117 = (0 < sVar145) * (sVar145 < 0x100) * auVar189[4] - (0xff < sVar145);
          sVar145 = auVar189._6_2_;
          bVar118 = (0 < sVar145) * (sVar145 < 0x100) * auVar189[6] - (0xff < sVar145);
          sVar145 = auVar189._8_2_;
          bVar119 = (0 < sVar145) * (sVar145 < 0x100) * auVar189[8] - (0xff < sVar145);
          sVar145 = auVar189._10_2_;
          bVar120 = (0 < sVar145) * (sVar145 < 0x100) * auVar189[10] - (0xff < sVar145);
          sVar145 = auVar189._12_2_;
          bVar121 = (0 < sVar145) * (sVar145 < 0x100) * auVar189[0xc] - (0xff < sVar145);
          sVar145 = auVar189._14_2_;
          bVar122 = (0 < sVar145) * (sVar145 < 0x100) * auVar189[0xe] - (0xff < sVar145);
          bVar123 = (uVar194 != 0) * (uVar194 < 0x100) * (char)uVar194 - (0xff < uVar194);
          bVar124 = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
          bVar125 = (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210);
          bVar126 = (uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211);
          bVar127 = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
          bVar128 = (uVar213 != 0) * (uVar213 < 0x100) * (char)uVar213 - (0xff < uVar213);
          bVar129 = (uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214);
          bVar130 = (uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215);
          bVar108 = auVar206[0];
          bVar108 = (bVar108 < bVar116) * bVar108 | (bVar108 >= bVar116) * bVar116;
          bVar116 = auVar206[1];
          bVar116 = (bVar116 < bVar64) * bVar116 | (bVar116 >= bVar64) * bVar64;
          bVar64 = auVar206[2];
          bVar117 = (bVar64 < bVar117) * bVar64 | (bVar64 >= bVar117) * bVar117;
          bVar64 = auVar206[3];
          bVar118 = (bVar64 < bVar118) * bVar64 | (bVar64 >= bVar118) * bVar118;
          bVar64 = auVar206[4];
          bVar119 = (bVar64 < bVar119) * bVar64 | (bVar64 >= bVar119) * bVar119;
          bVar64 = auVar206[5];
          bVar120 = (bVar64 < bVar120) * bVar64 | (bVar64 >= bVar120) * bVar120;
          bVar64 = auVar206[6];
          bVar121 = (bVar64 < bVar121) * bVar64 | (bVar64 >= bVar121) * bVar121;
          bVar64 = auVar206[7];
          bVar122 = (bVar64 < bVar122) * bVar64 | (bVar64 >= bVar122) * bVar122;
          bVar64 = auVar206[8];
          bVar123 = (bVar64 < bVar123) * bVar64 | (bVar64 >= bVar123) * bVar123;
          bVar64 = auVar206[9];
          bVar124 = (bVar64 < bVar124) * bVar64 | (bVar64 >= bVar124) * bVar124;
          bVar64 = auVar206[10];
          bVar125 = (bVar64 < bVar125) * bVar64 | (bVar64 >= bVar125) * bVar125;
          bVar64 = auVar206[0xb];
          bVar126 = (bVar64 < bVar126) * bVar64 | (bVar64 >= bVar126) * bVar126;
          bVar64 = auVar206[0xc];
          bVar127 = (bVar64 < bVar127) * bVar64 | (bVar64 >= bVar127) * bVar127;
          bVar64 = auVar206[0xd];
          bVar128 = (bVar64 < bVar128) * bVar64 | (bVar64 >= bVar128) * bVar128;
          bVar64 = auVar206[0xe];
          bVar129 = (bVar64 < bVar129) * bVar64 | (bVar64 >= bVar129) * bVar129;
          bVar64 = auVar206[0xf];
          bVar130 = (bVar64 < bVar130) * bVar64 | (bVar64 >= bVar130) * bVar130;
          bVar64 = auVar216[0];
          auVar109[0] = (bVar108 < bVar64) * bVar64 | (bVar108 >= bVar64) * bVar108;
          bVar64 = auVar216[1];
          auVar109[1] = (bVar116 < bVar64) * bVar64 | (bVar116 >= bVar64) * bVar116;
          bVar64 = auVar216[2];
          auVar109[2] = (bVar117 < bVar64) * bVar64 | (bVar117 >= bVar64) * bVar117;
          bVar64 = auVar216[3];
          auVar109[3] = (bVar118 < bVar64) * bVar64 | (bVar118 >= bVar64) * bVar118;
          bVar64 = auVar216[4];
          auVar109[4] = (bVar119 < bVar64) * bVar64 | (bVar119 >= bVar64) * bVar119;
          bVar64 = auVar216[5];
          auVar109[5] = (bVar120 < bVar64) * bVar64 | (bVar120 >= bVar64) * bVar120;
          bVar64 = auVar216[6];
          auVar109[6] = (bVar121 < bVar64) * bVar64 | (bVar121 >= bVar64) * bVar121;
          bVar64 = auVar216[7];
          auVar109[7] = (bVar122 < bVar64) * bVar64 | (bVar122 >= bVar64) * bVar122;
          bVar64 = auVar216[8];
          auVar109[8] = (bVar123 < bVar64) * bVar64 | (bVar123 >= bVar64) * bVar123;
          bVar64 = auVar216[9];
          auVar109[9] = (bVar124 < bVar64) * bVar64 | (bVar124 >= bVar64) * bVar124;
          bVar64 = auVar216[10];
          auVar109[10] = (bVar125 < bVar64) * bVar64 | (bVar125 >= bVar64) * bVar125;
          bVar64 = auVar216[0xb];
          auVar109[0xb] = (bVar126 < bVar64) * bVar64 | (bVar126 >= bVar64) * bVar126;
          bVar64 = auVar216[0xc];
          auVar112[0xc] = (bVar127 < bVar64) * bVar64 | (bVar127 >= bVar64) * bVar127;
          auVar112._0_12_ = auVar109;
          bVar64 = auVar216[0xd];
          auVar112[0xd] = (bVar128 < bVar64) * bVar64 | (bVar128 >= bVar64) * bVar128;
          bVar64 = auVar216[0xe];
          auVar112[0xe] = (bVar129 < bVar64) * bVar64 | (bVar129 >= bVar64) * bVar129;
          bVar64 = auVar216[0xf];
          auVar112[0xf] = (bVar130 < bVar64) * bVar64 | (bVar130 >= bVar64) * bVar130;
          uVar194 = (ushort)(sVar146 + auVar246._0_2_) >> 3;
          uVar209 = (ushort)(sVar169 + auVar246._2_2_) >> 3;
          uVar210 = (ushort)(sVar173 + auVar246._4_2_) >> 3;
          uVar211 = (ushort)(sVar177 + auVar246._6_2_) >> 3;
          uVar212 = (ushort)(sVar180 + auVar246._8_2_) >> 3;
          uVar213 = (ushort)(sVar182 + auVar246._10_2_) >> 3;
          uVar214 = (ushort)(sVar184 + auVar246._12_2_) >> 3;
          uVar215 = (ushort)(sVar186 + auVar246._14_2_) >> 3;
          bVar130 = (uVar194 != 0) * (uVar194 < 0x100) * (char)uVar194 - (0xff < uVar194);
          bVar129 = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
          bVar128 = (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210);
          bVar126 = (uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211);
          bVar116 = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
          bVar117 = (uVar213 != 0) * (uVar213 < 0x100) * (char)uVar213 - (0xff < uVar213);
          bVar64 = (uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214);
          bVar118 = (uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215);
          bVar119 = auVar140[0];
          bVar119 = (bVar119 < bVar130) * bVar119 | (bVar119 >= bVar130) * bVar130;
          bVar130 = auVar140[1];
          bVar129 = (bVar130 < bVar129) * bVar130 | (bVar130 >= bVar129) * bVar129;
          bVar130 = auVar140[2];
          bVar128 = (bVar130 < bVar128) * bVar130 | (bVar130 >= bVar128) * bVar128;
          bVar130 = auVar140[3];
          bVar126 = (bVar130 < bVar126) * bVar130 | (bVar130 >= bVar126) * bVar126;
          bVar130 = auVar140[4];
          bVar116 = (bVar130 < bVar116) * bVar130 | (bVar130 >= bVar116) * bVar116;
          bVar130 = auVar140[5];
          bVar117 = (bVar130 < bVar117) * bVar130 | (bVar130 >= bVar117) * bVar117;
          bVar130 = auVar140[6];
          bVar130 = (bVar130 < bVar64) * bVar130 | (bVar130 >= bVar64) * bVar64;
          bVar64 = auVar140[7];
          bVar118 = (bVar64 < bVar118) * bVar64 | (bVar64 >= bVar118) * bVar118;
          bVar64 = auVar140[8];
          bVar64 = (bVar64 < bVar98) * bVar64 | (bVar64 >= bVar98) * bVar98;
          bVar98 = auVar140[9];
          bVar120 = (bVar98 < bVar100) * bVar98 | (bVar98 >= bVar100) * bVar100;
          bVar98 = auVar140[10];
          bVar121 = (bVar98 < bVar101) * bVar98 | (bVar98 >= bVar101) * bVar101;
          bVar98 = auVar140[0xb];
          bVar122 = (bVar98 < bVar103) * bVar98 | (bVar98 >= bVar103) * bVar103;
          bVar98 = auVar140[0xc];
          bVar65 = (bVar98 < bVar65) * bVar98 | (bVar98 >= bVar65) * bVar65;
          bVar98 = auVar140[0xd];
          bVar66 = (bVar98 < bVar66) * bVar98 | (bVar98 >= bVar66) * bVar66;
          bVar98 = auVar140[0xe];
          bVar67 = (bVar98 < bVar67) * bVar98 | (bVar98 >= bVar67) * bVar67;
          bVar98 = auVar140[0xf];
          bVar68 = (bVar98 < bVar68) * bVar98 | (bVar98 >= bVar68) * bVar68;
          bVar98 = auVar27[0];
          bVar100 = auVar27[1];
          bVar101 = auVar27[2];
          bVar103 = auVar27[3];
          uVar38 = CONCAT13((bVar126 < bVar103) * bVar103 | (bVar126 >= bVar103) * bVar126,
                            CONCAT12((bVar128 < bVar101) * bVar101 | (bVar128 >= bVar101) * bVar128,
                                     CONCAT11((bVar129 < bVar100) * bVar100 |
                                              (bVar129 >= bVar100) * bVar129,
                                              (bVar119 < bVar98) * bVar98 |
                                              (bVar119 >= bVar98) * bVar119)));
          bVar98 = auVar27[4];
          bVar100 = auVar27[5];
          bVar101 = auVar27[6];
          bVar103 = auVar27[7];
          auVar39._0_8_ =
               CONCAT17((bVar118 < bVar103) * bVar103 | (bVar118 >= bVar103) * bVar118,
                        CONCAT16((bVar130 < bVar101) * bVar101 | (bVar130 >= bVar101) * bVar130,
                                 CONCAT15((bVar117 < bVar100) * bVar100 |
                                          (bVar117 >= bVar100) * bVar117,
                                          CONCAT14((bVar116 < bVar98) * bVar98 |
                                                   (bVar116 >= bVar98) * bVar116,uVar38))));
          bVar98 = auVar27[8];
          auVar39[8] = (bVar64 < bVar98) * bVar98 | (bVar64 >= bVar98) * bVar64;
          bVar98 = auVar27[9];
          auVar39[9] = (bVar120 < bVar98) * bVar98 | (bVar120 >= bVar98) * bVar120;
          bVar98 = auVar27[10];
          auVar39[10] = (bVar121 < bVar98) * bVar98 | (bVar121 >= bVar98) * bVar121;
          bVar98 = auVar27[0xb];
          auVar39[0xb] = (bVar122 < bVar98) * bVar98 | (bVar122 >= bVar98) * bVar122;
          bVar98 = auVar27[0xc];
          auVar48[0xc] = (bVar65 < bVar98) * bVar98 | (bVar65 >= bVar98) * bVar65;
          auVar48._0_12_ = auVar39;
          bVar98 = auVar27[0xd];
          auVar48[0xd] = (bVar66 < bVar98) * bVar98 | (bVar66 >= bVar98) * bVar66;
          bVar98 = auVar27[0xe];
          auVar48[0xe] = (bVar67 < bVar98) * bVar98 | (bVar67 >= bVar98) * bVar67;
          bVar98 = auVar27[0xf];
          auVar48[0xf] = (bVar68 < bVar98) * bVar98 | (bVar68 >= bVar98) * bVar68;
          auVar189 = pblendw(auVar29,auVar112,0xf);
          uVar13 = CONCAT44(auVar189._8_4_,auVar189._0_4_);
          uVar25 = CONCAT44(auVar189._12_4_,auVar189._4_4_);
          uVar79 = CONCAT44((int)(uVar1 >> 0x20),auVar112._12_4_);
          uVar26 = CONCAT44(auVar48._12_4_,(int)((ulong)auVar39._0_8_ >> 0x20));
          *(ulong *)(pu1_src + lVar24 * -3) = CONCAT44(auVar39._8_4_,uVar38);
          *puVar17 = CONCAT44((int)(uVar3 >> 0x20),auVar109._8_4_);
          puVar15 = (ulong *)pu1_src;
          puVar17 = puVar14;
          pUVar18 = pu1_src + lVar24 * 2;
          pu1_src = pu1_src + lVar24;
        }
        else {
          iVar19 = (iVar19 >> 1) + iVar19 >> 3;
          bVar20 = auVar189._0_4_ + auVar189._8_4_ < iVar19 && 1 < iVar16;
          bVar22 = auVar189._4_4_ + auVar189._12_4_ < iVar19 && 1 < iVar16;
          auVar141._4_4_ = iVar16;
          auVar141._0_4_ = iVar16;
          auVar141._8_4_ = iVar16;
          auVar141._12_4_ = iVar16;
          auVar52._0_12_ = auVar40._0_12_;
          auVar52._12_2_ = uVar62;
          auVar52._14_2_ = uVar193;
          auVar51._12_4_ = auVar52._12_4_;
          auVar51._0_10_ = auVar40._0_10_;
          auVar51._10_2_ = auVar148._4_2_;
          auVar50._10_6_ = auVar51._10_6_;
          auVar50._8_2_ = auVar41._4_2_;
          auVar50._0_8_ = auVar47._0_8_;
          auVar49._8_8_ = auVar50._8_8_;
          auVar49._6_2_ = auVar10._0_2_;
          auVar49._4_2_ = auVar7._0_2_;
          auVar49._2_2_ = auVar147._0_2_;
          auVar49._0_2_ = auVar40._0_2_;
          auVar189 = pmaddubsw(auVar49,(undefined1  [16])coef_de1);
          auVar216 = packssdw(auVar141,auVar141);
          auVar206 = pmovsxbw(auVar147,0xa0a0a0a0a0a0a0a);
          auVar140 = pmaddwd(auVar189,_DAT_00174510);
          auVar189 = pmaddubsw(auVar49,(undefined1  [16])coef_dep1);
          sVar145 = auVar216._0_2_;
          sVar146 = auVar216._2_2_;
          sVar168 = auVar216._4_2_;
          sVar169 = auVar216._6_2_;
          sVar172 = auVar216._8_2_;
          sVar173 = auVar216._10_2_;
          sVar176 = auVar216._12_2_;
          sVar177 = auVar216._14_2_;
          auVar190._0_4_ = auVar140._0_4_ + 8 >> 4;
          auVar190._4_4_ = auVar140._4_4_ + 8 >> 4;
          auVar190._8_4_ = auVar140._8_4_ + 8 >> 4;
          auVar190._12_4_ = auVar140._12_4_ + 8 >> 4;
          auVar208._8_4_ = 0xffffffff;
          auVar208._0_8_ = 0xffffffffffffffff;
          auVar208._12_4_ = 0xffffffff;
          auVar246 = psignd(auVar190,auVar208);
          auVar248 = psignw(auVar216,auVar208);
          auVar140 = packssdw(auVar190,auVar246);
          auVar246 = pabsw(auVar246,auVar140);
          auVar115._0_2_ = -(ushort)(auVar246._0_2_ < (short)(auVar206._0_2_ * sVar145));
          auVar115._2_2_ = -(ushort)(auVar246._2_2_ < (short)(auVar206._2_2_ * sVar146));
          auVar115._4_2_ = -(ushort)(auVar246._4_2_ < (short)(auVar206._4_2_ * sVar168));
          auVar115._6_2_ = -(ushort)(auVar246._6_2_ < (short)(auVar206._6_2_ * sVar169));
          auVar115._8_2_ = -(ushort)(auVar246._8_2_ < (short)(auVar206._8_2_ * sVar172));
          auVar115._10_2_ = -(ushort)(auVar246._10_2_ < (short)(auVar206._10_2_ * sVar173));
          auVar115._12_2_ = -(ushort)(auVar246._12_2_ < (short)(auVar206._12_2_ * sVar176));
          auVar115._14_2_ = -(ushort)(auVar246._14_2_ < (short)(auVar206._14_2_ * sVar177));
          sVar179 = auVar140._0_2_;
          uVar194 = (ushort)(sVar145 < sVar179) * sVar145 | (ushort)(sVar145 >= sVar179) * sVar179;
          sVar145 = auVar140._2_2_;
          uVar209 = (ushort)(sVar146 < sVar145) * sVar146 | (ushort)(sVar146 >= sVar145) * sVar145;
          sVar145 = auVar140._4_2_;
          uVar210 = (ushort)(sVar168 < sVar145) * sVar168 | (ushort)(sVar168 >= sVar145) * sVar145;
          sVar145 = auVar140._6_2_;
          uVar211 = (ushort)(sVar169 < sVar145) * sVar169 | (ushort)(sVar169 >= sVar145) * sVar145;
          sVar145 = auVar140._8_2_;
          uVar212 = (ushort)(sVar172 < sVar145) * sVar172 | (ushort)(sVar172 >= sVar145) * sVar145;
          sVar145 = auVar140._10_2_;
          uVar213 = (ushort)(sVar173 < sVar145) * sVar173 | (ushort)(sVar173 >= sVar145) * sVar145;
          sVar145 = auVar140._12_2_;
          sVar146 = auVar140._14_2_;
          uVar214 = (ushort)(sVar176 < sVar145) * sVar176 | (ushort)(sVar176 >= sVar145) * sVar145;
          uVar215 = (ushort)(sVar177 < sVar146) * sVar177 | (ushort)(sVar177 >= sVar146) * sVar146;
          sVar145 = auVar248._0_2_;
          auVar191._0_2_ =
               (ushort)((short)uVar194 < sVar145) * sVar145 | ((short)uVar194 >= sVar145) * uVar194;
          sVar145 = auVar248._2_2_;
          auVar191._2_2_ =
               (ushort)((short)uVar209 < sVar145) * sVar145 | ((short)uVar209 >= sVar145) * uVar209;
          sVar145 = auVar248._4_2_;
          auVar191._4_2_ =
               (ushort)((short)uVar210 < sVar145) * sVar145 | ((short)uVar210 >= sVar145) * uVar210;
          sVar145 = auVar248._6_2_;
          auVar191._6_2_ =
               (ushort)((short)uVar211 < sVar145) * sVar145 | ((short)uVar211 >= sVar145) * uVar211;
          sVar145 = auVar248._8_2_;
          auVar191._8_2_ =
               (ushort)((short)uVar212 < sVar145) * sVar145 | ((short)uVar212 >= sVar145) * uVar212;
          sVar145 = auVar248._10_2_;
          auVar191._10_2_ =
               (ushort)((short)uVar213 < sVar145) * sVar145 | ((short)uVar213 >= sVar145) * uVar213;
          sVar145 = auVar248._12_2_;
          auVar191._12_2_ =
               (ushort)((short)uVar214 < sVar145) * sVar145 | ((short)uVar214 >= sVar145) * uVar214;
          sVar145 = auVar248._14_2_;
          auVar191._14_2_ =
               (ushort)((short)uVar215 < sVar145) * sVar145 | ((short)uVar215 >= sVar145) * uVar215;
          auVar140 = psraw(auVar216,1);
          auVar206 = pmovzxbw(auVar110,auVar110);
          auVar216 = pmovzxbw(auVar90,auVar90);
          auVar247._1_3_ = 0;
          auVar247[0] = bVar20;
          auVar247[4] = bVar20;
          auVar247._5_3_ = 0;
          auVar247[8] = bVar22;
          auVar247._9_3_ = 0;
          auVar247[0xc] = bVar22;
          auVar247._13_3_ = 0;
          auVar113._4_4_ = filter_flag_p;
          auVar113._0_4_ = filter_flag_p;
          auVar113._8_4_ = filter_flag_q;
          auVar113._12_4_ = filter_flag_q;
          auVar247 = auVar247 & auVar113;
          auVar114._0_4_ = (filter_flag_p << 0x1f) >> 0x1f;
          auVar114._4_4_ = (filter_flag_p << 0x1f) >> 0x1f;
          auVar114._8_4_ = (filter_flag_q << 0x1f) >> 0x1f;
          auVar114._12_4_ = (filter_flag_q << 0x1f) >> 0x1f;
          auVar189 = pshufb(auVar189,(undefined1  [16])shuffle1);
          auVar53._0_2_ = auVar189._0_2_ + auVar216._0_2_ + auVar191._0_2_ * 2 + 1;
          auVar53._2_2_ = auVar189._2_2_ + auVar216._2_2_ + auVar191._2_2_ * 2 + 1;
          auVar53._4_2_ = auVar189._4_2_ + auVar216._4_2_ + auVar191._4_2_ * 2 + 1;
          auVar53._6_2_ = auVar189._6_2_ + auVar216._6_2_ + auVar191._6_2_ * 2 + 1;
          auVar53._8_2_ = auVar189._8_2_ + auVar206._0_2_ + auVar191._8_2_ * 2 + 1;
          auVar53._10_2_ = auVar189._10_2_ + auVar206._2_2_ + auVar191._10_2_ * 2 + 1;
          auVar53._12_2_ = auVar189._12_2_ + auVar206._4_2_ + auVar191._12_2_ * 2 + 1;
          auVar53._14_2_ = auVar189._14_2_ + auVar206._6_2_ + auVar191._14_2_ * 2 + 1;
          auVar189 = psraw(auVar53,2);
          sVar145 = auVar140._0_2_;
          sVar146 = auVar189._0_2_;
          uVar194 = (ushort)(sVar145 < sVar146) * sVar145 | (ushort)(sVar145 >= sVar146) * sVar146;
          sVar145 = auVar140._2_2_;
          sVar146 = auVar189._2_2_;
          uVar209 = (ushort)(sVar145 < sVar146) * sVar145 | (ushort)(sVar145 >= sVar146) * sVar146;
          sVar145 = auVar140._4_2_;
          sVar146 = auVar189._4_2_;
          uVar210 = (ushort)(sVar145 < sVar146) * sVar145 | (ushort)(sVar145 >= sVar146) * sVar146;
          sVar145 = auVar140._6_2_;
          sVar146 = auVar189._6_2_;
          uVar211 = (ushort)(sVar145 < sVar146) * sVar145 | (ushort)(sVar145 >= sVar146) * sVar146;
          sVar145 = auVar140._8_2_;
          sVar146 = auVar189._8_2_;
          uVar212 = (ushort)(sVar145 < sVar146) * sVar145 | (ushort)(sVar145 >= sVar146) * sVar146;
          sVar145 = auVar140._10_2_;
          sVar146 = auVar189._10_2_;
          uVar213 = (ushort)(sVar145 < sVar146) * sVar145 | (ushort)(sVar145 >= sVar146) * sVar146;
          sVar145 = auVar140._12_2_;
          sVar146 = auVar189._12_2_;
          sVar168 = auVar189._14_2_;
          uVar214 = (ushort)(sVar145 < sVar146) * sVar145 | (ushort)(sVar145 >= sVar146) * sVar146;
          sVar145 = auVar140._14_2_;
          uVar215 = (ushort)(sVar145 < sVar168) * sVar145 | (ushort)(sVar145 >= sVar168) * sVar168;
          auVar189 = psignw(auVar140,auVar208);
          auVar55._0_4_ = (auVar247._0_4_ << 0x1f) >> 0x1f;
          auVar55._4_4_ = (auVar247._4_4_ << 0x1f) >> 0x1f;
          auVar55._8_4_ = (auVar247._8_4_ << 0x1f) >> 0x1f;
          auVar55._12_4_ = (auVar247._12_4_ << 0x1f) >> 0x1f;
          sVar145 = auVar189._0_2_;
          auVar54._0_2_ =
               (ushort)((short)uVar194 < sVar145) * sVar145 | ((short)uVar194 >= sVar145) * uVar194;
          sVar145 = auVar189._2_2_;
          auVar54._2_2_ =
               (ushort)((short)uVar209 < sVar145) * sVar145 | ((short)uVar209 >= sVar145) * uVar209;
          sVar145 = auVar189._4_2_;
          auVar54._4_2_ =
               (ushort)((short)uVar210 < sVar145) * sVar145 | ((short)uVar210 >= sVar145) * uVar210;
          sVar145 = auVar189._6_2_;
          auVar54._6_2_ =
               (ushort)((short)uVar211 < sVar145) * sVar145 | ((short)uVar211 >= sVar145) * uVar211;
          sVar145 = auVar189._8_2_;
          auVar54._8_2_ =
               (ushort)((short)uVar212 < sVar145) * sVar145 | ((short)uVar212 >= sVar145) * uVar212;
          sVar145 = auVar189._10_2_;
          auVar54._10_2_ =
               (ushort)((short)uVar213 < sVar145) * sVar145 | ((short)uVar213 >= sVar145) * uVar213;
          sVar145 = auVar189._12_2_;
          auVar54._12_2_ =
               (ushort)((short)uVar214 < sVar145) * sVar145 | ((short)uVar214 >= sVar145) * uVar214;
          sVar145 = auVar189._14_2_;
          auVar54._14_2_ =
               (ushort)((short)uVar215 < sVar145) * sVar145 | ((short)uVar215 >= sVar145) * uVar215;
          auVar55 = auVar54 & auVar115 & auVar55;
          auVar115 = auVar114 & auVar191 & auVar115;
          auVar93._8_8_ = 0;
          auVar93._0_8_ = auVar115._0_8_;
          auVar216 = pmovzxbw(auVar28,auVar28);
          sVar179 = auVar216._0_2_ + auVar115._0_2_;
          sVar180 = auVar216._2_2_ + auVar115._2_2_;
          sVar181 = auVar216._4_2_ + auVar115._4_2_;
          sVar182 = auVar216._6_2_ + auVar115._6_2_;
          sVar183 = auVar216._8_2_;
          sVar184 = auVar216._10_2_;
          sVar185 = auVar216._12_2_;
          sVar186 = auVar216._14_2_;
          auVar206 = pmovzxbw(auVar80,auVar80);
          sVar78 = auVar206._0_2_ + auVar115._8_2_;
          sVar81 = auVar206._2_2_ + auVar115._10_2_;
          sVar82 = auVar206._4_2_ + auVar115._12_2_;
          sVar83 = auVar206._6_2_ + auVar115._14_2_;
          sVar84 = auVar206._8_2_;
          sVar85 = auVar206._10_2_;
          sVar86 = auVar206._12_2_;
          sVar87 = auVar206._14_2_;
          auVar140 = pmovzxbw(auVar93,auVar27);
          sVar89 = auVar140._0_2_ + auVar55._0_2_;
          sVar96 = auVar140._2_2_ + auVar55._2_2_;
          sVar99 = auVar140._4_2_ + auVar55._4_2_;
          sVar102 = auVar140._6_2_ + auVar55._6_2_;
          sVar104 = auVar140._8_2_;
          sVar105 = auVar140._10_2_;
          sVar106 = auVar140._12_2_;
          sVar107 = auVar140._14_2_;
          auVar189 = pmovzxbw(auVar27,auVar69);
          sVar145 = auVar189._0_2_ + auVar55._8_2_;
          sVar146 = auVar189._2_2_ + auVar55._10_2_;
          sVar168 = auVar189._4_2_ + auVar55._12_2_;
          sVar169 = auVar189._6_2_ + auVar55._14_2_;
          sVar172 = auVar189._8_2_;
          sVar173 = auVar189._10_2_;
          sVar176 = auVar189._12_2_;
          sVar177 = auVar189._14_2_;
          uVar13 = CONCAT17((0 < sVar107) * (sVar107 < 0x100) * auVar140[0xe] - (0xff < sVar107),
                            CONCAT16((0 < sVar106) * (sVar106 < 0x100) * auVar140[0xc] -
                                     (0xff < sVar106),
                                     CONCAT15((0 < sVar105) * (sVar105 < 0x100) * auVar140[10] -
                                              (0xff < sVar105),
                                              CONCAT14((0 < sVar104) * (sVar104 < 0x100) *
                                                       auVar140[8] - (0xff < sVar104),
                                                       CONCAT13((0 < sVar102) * (sVar102 < 0x100) *
                                                                (char)sVar102 - (0xff < sVar102),
                                                                CONCAT12((0 < sVar99) *
                                                                         (sVar99 < 0x100) *
                                                                         (char)sVar99 -
                                                                         (0xff < sVar99),
                                                                         CONCAT11((0 < sVar96) *
                                                                                  (sVar96 < 0x100) *
                                                                                  (char)sVar96 -
                                                                                  (0xff < sVar96),
                                                                                  (0 < sVar89) *
                                                                                  (sVar89 < 0x100) *
                                                                                  (char)sVar89 -
                                                                                  (0xff < sVar89))))
                                                      ))));
          uVar25 = CONCAT17((0 < sVar186) * (sVar186 < 0x100) * auVar216[0xe] - (0xff < sVar186),
                            CONCAT16((0 < sVar185) * (sVar185 < 0x100) * auVar216[0xc] -
                                     (0xff < sVar185),
                                     CONCAT15((0 < sVar184) * (sVar184 < 0x100) * auVar216[10] -
                                              (0xff < sVar184),
                                              CONCAT14((0 < sVar183) * (sVar183 < 0x100) *
                                                       auVar216[8] - (0xff < sVar183),
                                                       CONCAT13((0 < sVar182) * (sVar182 < 0x100) *
                                                                (char)sVar182 - (0xff < sVar182),
                                                                CONCAT12((0 < sVar181) *
                                                                         (sVar181 < 0x100) *
                                                                         (char)sVar181 -
                                                                         (0xff < sVar181),
                                                                         CONCAT11((0 < sVar180) *
                                                                                  (sVar180 < 0x100)
                                                                                  * (char)sVar180 -
                                                                                  (0xff < sVar180),
                                                                                  (0 < sVar179) *
                                                                                  (sVar179 < 0x100)
                                                                                  * (char)sVar179 -
                                                                                  (0xff < sVar179)))
                                                               )))));
          uVar26 = CONCAT17((0 < sVar177) * (sVar177 < 0x100) * auVar189[0xe] - (0xff < sVar177),
                            CONCAT16((0 < sVar176) * (sVar176 < 0x100) * auVar189[0xc] -
                                     (0xff < sVar176),
                                     CONCAT15((0 < sVar173) * (sVar173 < 0x100) * auVar189[10] -
                                              (0xff < sVar173),
                                              CONCAT14((0 < sVar172) * (sVar172 < 0x100) *
                                                       auVar189[8] - (0xff < sVar172),
                                                       CONCAT13((0 < sVar169) * (sVar169 < 0x100) *
                                                                (char)sVar169 - (0xff < sVar169),
                                                                CONCAT12((0 < sVar168) *
                                                                         (sVar168 < 0x100) *
                                                                         (char)sVar168 -
                                                                         (0xff < sVar168),
                                                                         CONCAT11((0 < sVar146) *
                                                                                  (sVar146 < 0x100)
                                                                                  * (char)sVar146 -
                                                                                  (0xff < sVar146),
                                                                                  (0 < sVar145) *
                                                                                  (sVar145 < 0x100)
                                                                                  * (char)sVar145 -
                                                                                  (0xff < sVar145)))
                                                               )))));
          uVar79 = CONCAT17((0 < sVar87) * (sVar87 < 0x100) * auVar206[0xe] - (0xff < sVar87),
                            CONCAT16((0 < sVar86) * (sVar86 < 0x100) * auVar206[0xc] -
                                     (0xff < sVar86),
                                     CONCAT15((0 < sVar85) * (sVar85 < 0x100) * auVar206[10] -
                                              (0xff < sVar85),
                                              CONCAT14((0 < sVar84) * (sVar84 < 0x100) * auVar206[8]
                                                       - (0xff < sVar84),
                                                       CONCAT13((0 < sVar83) * (sVar83 < 0x100) *
                                                                (char)sVar83 - (0xff < sVar83),
                                                                CONCAT12((0 < sVar82) *
                                                                         (sVar82 < 0x100) *
                                                                         (char)sVar82 -
                                                                         (0xff < sVar82),
                                                                         CONCAT11((0 < sVar81) *
                                                                                  (sVar81 < 0x100) *
                                                                                  (char)sVar81 -
                                                                                  (0xff < sVar81),
                                                                                  (0 < sVar78) *
                                                                                  (sVar78 < 0x100) *
                                                                                  (char)sVar78 -
                                                                                  (0xff < sVar78))))
                                                      ))));
          puVar15 = puVar14;
          pUVar18 = pu1_src + lVar24;
        }
        *puVar17 = uVar13;
        *puVar15 = uVar25;
        *(undefined8 *)pu1_src = uVar79;
        *(undefined8 *)pUVar18 = uVar26;
      }
    }
    return;
  }
  __assert_fail("(filter_flag_p || filter_flag_q)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_deblk_ssse3_intr.c"
                ,0x236,
                "void ihevc_deblk_luma_horz_ssse3(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_deblk_luma_horz_ssse3(UWORD8 *pu1_src,
                                 WORD32 src_strd,
                                 WORD32 bs,
                                 WORD32 quant_param_p,
                                 WORD32 quant_param_q,
                                 WORD32 beta_offset_div2,
                                 WORD32 tc_offset_div2,
                                 WORD32 filter_flag_p,
                                 WORD32 filter_flag_q)
{
    WORD32 qp_luma, beta_indx, tc_indx;
    WORD32 beta, tc;

    WORD32 d0, d3, dp, dq, d;
    WORD32 de_0, de_1, de_2, de_3;
    WORD32 d_sam0, d_sam3;
    WORD32 de, dep, deq;

    __m128i src_q0_8x16b, src_q1_8x16b, src_p0_8x16b, src_p1_8x16b, src_q2_8x16b;
    __m128i tmp_pq_str1_8x16b, src_p2_8x16b, tmp_pq_str0_8x16b;




    {
        __m128i src_tmp_p_0_8x16b, src_tmp_p_1_8x16b, src_tmp_q_0_8x16b, src_tmp_q_1_8x16b;
        __m128i coef_8x16b, mask_d_result_4x32b, mask_de_result_8x16b;
        __m128i mask_16x8b, temp_coef0_8x16b, temp_coef1_8x16b;

        ASSERT((bs > 0));
        ASSERT(filter_flag_p || filter_flag_q);

        qp_luma = (quant_param_p + quant_param_q + 1) >> 1;
        beta_indx = CLIP3(qp_luma + (beta_offset_div2 << 1), 0, 51);

        /* BS based on implementation can take value 3 if it is intra/inter egde          */
        /* based on BS, tc index is calcuated by adding 2 * ( bs - 1) to QP and tc_offset */
        /* for BS = 1 adding factor is (0*2), BS = 2 or 3 adding factor is (1*2)          */
        /* the above desired functionallity is achieved by doing (2*(bs>>1))              */

        tc_indx = CLIP3(qp_luma + 2 * (bs >> 1) + (tc_offset_div2 << 1), 0, 53);

        beta = gai4_ihevc_beta_table[beta_indx];
        tc = gai4_ihevc_tc_table[tc_indx];
        if(0 == tc)
        {
            return;
        }
        src_q0_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src));
        src_q1_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src + src_strd));
        src_p0_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - src_strd));
        src_p1_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - 2 * src_strd));
        src_q2_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd));
        tmp_pq_str1_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd));
        src_p2_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - 3 * src_strd));
        tmp_pq_str0_8x16b = _mm_loadl_epi64((__m128i *)(pu1_src - 4 * src_strd));


        src_tmp_p_0_8x16b = _mm_unpacklo_epi8(src_p1_8x16b, src_p0_8x16b);
        src_tmp_p_1_8x16b = _mm_unpacklo_epi8(tmp_pq_str0_8x16b, src_p2_8x16b);

        src_tmp_q_0_8x16b = _mm_unpacklo_epi8(src_q0_8x16b, src_q1_8x16b);
        src_tmp_q_1_8x16b = _mm_unpacklo_epi8(src_q2_8x16b, tmp_pq_str1_8x16b);

        src_tmp_p_0_8x16b = _mm_unpacklo_epi16(src_tmp_p_1_8x16b, src_tmp_p_0_8x16b);
        src_tmp_q_0_8x16b = _mm_unpacklo_epi16(src_tmp_q_0_8x16b, src_tmp_q_1_8x16b);

        src_tmp_p_0_8x16b = _mm_shuffle_epi32(src_tmp_p_0_8x16b, 0x6c);
        src_tmp_q_0_8x16b = _mm_shuffle_epi32(src_tmp_q_0_8x16b, 0x6c);

        coef_8x16b = _mm_load_si128((__m128i *)(coef_d));
        mask_16x8b =  _mm_load_si128((__m128i *)(shuffle_d));

        src_tmp_p_0_8x16b = _mm_unpacklo_epi32(src_tmp_p_0_8x16b, src_tmp_q_0_8x16b);
        //WORD32 shuffle_d[4]={0x80800403,0x80800c0b,0x03000704,0x0b080f0c};
        mask_de_result_8x16b = _mm_shuffle_epi8(src_tmp_p_0_8x16b, mask_16x8b);

        mask_d_result_4x32b = _mm_maddubs_epi16(src_tmp_p_0_8x16b, coef_8x16b);


        //to get all 1's of 8 bit in (1)
        temp_coef0_8x16b = _mm_cmpeq_epi16(src_tmp_p_0_8x16b, src_tmp_p_0_8x16b);
        temp_coef1_8x16b = _mm_srli_epi16(temp_coef0_8x16b, 15);
        //accumulating values foe dp3 dq3 , dp0 dq0 values
        mask_d_result_4x32b = _mm_madd_epi16(mask_d_result_4x32b, temp_coef1_8x16b);

        temp_coef1_8x16b = _mm_packus_epi16(temp_coef1_8x16b, temp_coef1_8x16b);
        // to get all 1,-1 sets of 16 bits in (0)
        temp_coef0_8x16b = _mm_unpacklo_epi8(temp_coef0_8x16b, temp_coef1_8x16b);
        //q33-q30,p33-p30,q03-q00,p03-p00,0,q30-p30,0,q00-p00
        mask_de_result_8x16b = _mm_maddubs_epi16(mask_de_result_8x16b, temp_coef0_8x16b);
        //to get 16 bit 1's
        temp_coef0_8x16b = _mm_srli_epi16(temp_coef1_8x16b, 8);


        // dq3 dp3 dq0 dp0
        mask_d_result_4x32b = _mm_abs_epi32(mask_d_result_4x32b);
        mask_16x8b = _mm_shuffle_epi32(mask_d_result_4x32b, 0xec);
        mask_d_result_4x32b = _mm_shuffle_epi32(mask_d_result_4x32b, 0x49);
        // dq dp d3 d0
        mask_d_result_4x32b = _mm_add_epi32(mask_d_result_4x32b, mask_16x8b);
        //|q33-q30|,|p33-p30|,|q03-q00|,|p03-p00|,0,|q30-p30|,0,|q00-p00|
        mask_de_result_8x16b = _mm_abs_epi16(mask_de_result_8x16b);
        //|q33-q30|+|p33-p30|,|q03-q00|+|p03-p00|,0+|q30-p30|,0+|q00-p00|
        mask_de_result_8x16b = _mm_madd_epi16(mask_de_result_8x16b, temp_coef0_8x16b);

        ///store back in a single variable
        temp_coef0_8x16b = _mm_srli_si128(mask_d_result_4x32b, 4);
        temp_coef1_8x16b = _mm_srli_si128(mask_d_result_4x32b, 8);
        mask_16x8b = _mm_srli_si128(mask_d_result_4x32b, 12);

        d0 = _mm_cvtsi128_si32(mask_d_result_4x32b);
        d3 = _mm_cvtsi128_si32(temp_coef0_8x16b);
        dp = _mm_cvtsi128_si32(temp_coef1_8x16b);
        dq = _mm_cvtsi128_si32(mask_16x8b);
        //getting d
        d = d0 + d3;

        ///store back in a single variable
        temp_coef0_8x16b = _mm_srli_si128(mask_de_result_8x16b, 4);
        temp_coef1_8x16b = _mm_srli_si128(mask_de_result_8x16b, 8);
        mask_16x8b = _mm_srli_si128(mask_de_result_8x16b, 12);

        de_0 = _mm_cvtsi128_si32(mask_de_result_8x16b);
        de_1 = _mm_cvtsi128_si32(temp_coef0_8x16b);
        de_2 = _mm_cvtsi128_si32(temp_coef1_8x16b);
        de_3 = _mm_cvtsi128_si32(mask_16x8b);

        de = 0;
        dep = 0;
        deq = 0;
        if(d < beta)
        {
            d_sam0 = 0;
            if((2 * d0 < (beta >> 2))
                            && (de_2 < (beta >> 3))
                            && (de_0 < ((5 * tc + 1) >> 1)))
            {
                d_sam0 = 1;
            }

            d_sam3 = 0;
            if((2 * d3 < (beta >> 2))
                            && (de_3 < (beta >> 3))
                            && de_1 < ((5 * tc + 1) >> 1))
            {
                d_sam3 = 1;
            }

            de = (d_sam0 & d_sam3) + 1;
            dep = (dp < (beta + (beta >> 1)) >> 3) ? 1 : 0;
            deq = (dq < (beta + (beta >> 1)) >> 3) ? 1 : 0;
            if(tc <= 1)
            {
                dep = 0;
                deq = 0;
            }
        }

    }

    if(de != 0)
    {

        if(2 == de)
        {

            __m128i temp_pq0_str0_16x8b;
            __m128i temp_pq1_str0_16x8b, temp_pq1_str1_16x8b;
            __m128i temp_pq2_str0_16x8b;
            __m128i temp_str0_16x8b, temp_str1_16x8b;
            __m128i const2_8x16b, const2tc_8x16b;

            LWORD64 mask, tc2;
            tc = tc << 1;
            mask = (((LWORD64)filter_flag_q) << 63) | (((LWORD64)filter_flag_p) << 31);
            tc2 = ((LWORD64)tc);

            const2_8x16b = _mm_cmpeq_epi16(src_p1_8x16b, src_p1_8x16b);
            //q'0-q'1-2 ,p'0-p'1-2
            temp_pq0_str0_16x8b = _mm_unpacklo_epi8(src_p1_8x16b, src_p0_8x16b);
            temp_str0_16x8b   = _mm_unpacklo_epi8(src_q0_8x16b, src_q1_8x16b);
            const2_8x16b = _mm_srli_epi16(const2_8x16b, 15);
            //arranged q31 q30 q21 q20 q1 q10 q01 q00 p30 p31 p20 p21 p10 p11 p00 p01
            temp_pq0_str0_16x8b = _mm_unpacklo_epi64(temp_pq0_str0_16x8b, temp_str0_16x8b);

            const2_8x16b = _mm_packus_epi16(const2_8x16b, const2_8x16b);
            temp_pq0_str0_16x8b = _mm_maddubs_epi16(temp_pq0_str0_16x8b, const2_8x16b);

            //q'1-2, p'1-2
            temp_pq1_str0_16x8b = _mm_unpacklo_epi8(src_p0_8x16b, src_q0_8x16b);
            temp_pq1_str1_16x8b = _mm_unpacklo_epi8(src_q1_8x16b, src_q2_8x16b);
            temp_str1_16x8b = _mm_unpacklo_epi8(src_p1_8x16b, src_p2_8x16b);
            // q30 p30 q20 p20 q10 p10 q01 q00 p30 q20 p20 q10 p10 q01 q00 p00
            temp_pq1_str0_16x8b = _mm_unpacklo_epi64(temp_pq1_str0_16x8b, temp_pq1_str0_16x8b);
            // q32 q31 q22 q21 q12 q11 q02 q01 p32 p31 p22 p21 p12 p11 p02 p01
            temp_pq1_str1_16x8b = _mm_unpacklo_epi64(temp_str1_16x8b, temp_pq1_str1_16x8b);

            temp_pq1_str0_16x8b = _mm_maddubs_epi16(temp_pq1_str0_16x8b, const2_8x16b);
            temp_pq1_str1_16x8b = _mm_maddubs_epi16(temp_pq1_str1_16x8b, const2_8x16b);

            //clipping mask design
            temp_str1_16x8b = _mm_setzero_si128();
            temp_str0_16x8b = _mm_loadl_epi64((__m128i *)(&mask));
            const2tc_8x16b  = _mm_loadl_epi64((__m128i *)(&tc2));
            temp_str0_16x8b = _mm_shuffle_epi32(temp_str0_16x8b, 0x44);
            const2tc_8x16b  = _mm_shuffle_epi8(const2tc_8x16b, temp_str1_16x8b);

            //clipping mask design
            temp_str0_16x8b = _mm_srai_epi32(temp_str0_16x8b, 31);
            const2tc_8x16b = _mm_and_si128(const2tc_8x16b, temp_str0_16x8b);
            //calculating Clipping MAX for all pixel values.
            src_p0_8x16b = _mm_unpacklo_epi32(src_p0_8x16b, src_q0_8x16b);
            src_q0_8x16b = _mm_unpacklo_epi32(src_p1_8x16b, src_q1_8x16b);
            //for clipping calc
            src_p1_8x16b = _mm_unpacklo_epi64(src_p0_8x16b, src_q0_8x16b);
            //saving the unmodified data of q1 p1 q0 p0
            src_q1_8x16b = _mm_unpackhi_epi64(src_p0_8x16b, src_q0_8x16b);
            //CLIpping MAX and MIN for q1 p1 q0 p0
            src_p0_8x16b = _mm_adds_epu8(src_p1_8x16b, const2tc_8x16b);
            src_p1_8x16b = _mm_subs_epu8(src_p1_8x16b, const2tc_8x16b);


            //q'2-q'0-2,p'2-p'0-2
            tmp_pq_str0_8x16b = _mm_unpacklo_epi8(src_p2_8x16b, tmp_pq_str0_8x16b);
            temp_pq2_str0_16x8b = _mm_unpacklo_epi8(src_q2_8x16b, tmp_pq_str1_8x16b);
            const2_8x16b = _mm_slli_epi16(const2_8x16b, 1);
            //arranged q33 q32 q23 q22 q13 q12 q03 q02 p32 p33 p22 p23 p12 p13 p02 p03
            temp_pq2_str0_16x8b = _mm_unpacklo_epi64(tmp_pq_str0_8x16b, temp_pq2_str0_16x8b);
            src_p2_8x16b = _mm_unpacklo_epi32(src_p2_8x16b, src_q2_8x16b);
            temp_pq2_str0_16x8b = _mm_maddubs_epi16(temp_pq2_str0_16x8b, const2_8x16b);

            //calculating Clipping MAX and MIN for p2 and q2 .
            tmp_pq_str0_8x16b = _mm_adds_epu8(src_p2_8x16b, const2tc_8x16b);
            tmp_pq_str1_8x16b = _mm_subs_epu8(src_p2_8x16b, const2tc_8x16b);
            //q'0-q'1-2 ,p'0-p'1-2
            temp_str0_16x8b = _mm_shuffle_epi32(temp_pq0_str0_16x8b, 0x4e);
            temp_pq0_str0_16x8b = _mm_add_epi16(temp_pq0_str0_16x8b, temp_str0_16x8b);
            //q'1-2 p'1-2
            temp_pq1_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, temp_pq1_str1_16x8b);
            //to get 2 in 16 bit
            const2_8x16b = _mm_srli_epi16(const2_8x16b, 8);


            //q'1, p'1 (adding 2)
            temp_pq1_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, const2_8x16b);
            //q'0-q'1,p'0-p'1
            temp_pq0_str0_16x8b = _mm_add_epi16(temp_pq0_str0_16x8b, const2_8x16b);
            //q'2-q'1,p'2-p'1
            temp_pq2_str0_16x8b = _mm_add_epi16(temp_pq2_str0_16x8b, const2_8x16b);
            //q'0 = (q'0-q'1)+q'1 ,p'0 = (p'0-p'1)+p'1;
            temp_pq0_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, temp_pq0_str0_16x8b);
            //q'2 = (q'2-q'1)+q'1 ,p'2 = (p'2-p'1)+p'1;
            temp_pq2_str0_16x8b = _mm_add_epi16(temp_pq1_str0_16x8b, temp_pq2_str0_16x8b);

            //normalisation of all modified pixels
            temp_pq0_str0_16x8b = _mm_srai_epi16(temp_pq0_str0_16x8b, 3);
            temp_pq1_str0_16x8b = _mm_srai_epi16(temp_pq1_str0_16x8b, 2);
            temp_pq2_str0_16x8b = _mm_srai_epi16(temp_pq2_str0_16x8b, 3);
            //q'1 p'1 q'0 p'0
            temp_pq0_str0_16x8b = _mm_packus_epi16(temp_pq0_str0_16x8b, temp_pq1_str0_16x8b);
            temp_pq2_str0_16x8b = _mm_packus_epi16(temp_pq2_str0_16x8b, temp_pq2_str0_16x8b);
            //pack with the unmodified data of q2 and p2
            src_p2_8x16b = _mm_unpackhi_epi64(temp_pq2_str0_16x8b, src_p2_8x16b);
            //Clipping MAX and MIN for q'1 p'1 q'0 p'0 and q'2  p'2
            temp_pq0_str0_16x8b = _mm_min_epu8(temp_pq0_str0_16x8b, src_p0_8x16b);
            src_p2_8x16b = _mm_min_epu8(src_p2_8x16b, tmp_pq_str0_8x16b);
            temp_pq0_str0_16x8b = _mm_max_epu8(temp_pq0_str0_16x8b, src_p1_8x16b);
            src_p2_8x16b = _mm_max_epu8(src_p2_8x16b, tmp_pq_str1_8x16b);
            //Reshuffling q'1 p'1 q'0 p'0 along with unmodified data
            src_p0_8x16b = _mm_unpacklo_epi32(temp_pq0_str0_16x8b, src_q1_8x16b);
            src_p1_8x16b = _mm_unpackhi_epi32(temp_pq0_str0_16x8b, src_q1_8x16b);
            src_p2_8x16b = _mm_shuffle_epi32(src_p2_8x16b, 0xd8);
            src_q0_8x16b = _mm_srli_si128(src_p0_8x16b, 8);
            src_q1_8x16b = _mm_srli_si128(src_p1_8x16b, 8);
            src_q2_8x16b = _mm_srli_si128(src_p2_8x16b, 8);

            _mm_storel_epi64((__m128i *)(pu1_src - 3 * src_strd), src_p2_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src - 2 * src_strd), src_p1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src - src_strd), src_p0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src), src_q0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src + src_strd), src_q1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src + 2 * src_strd), src_q2_8x16b);


        }

        else
        {

            __m128i tmp_delta0_8x16b, tmp_delta1_8x16b;
            __m128i tmp0_const_8x16b, tmp1_const_8x16b, tmp2_const_8x16b;
            __m128i coefdelta_0_8x16b;
            __m128i const2_8x16b, consttc_8x16b;

            LWORD64 maskp0, maskp1, maskq0, maskq1;
            maskp0 = (LWORD64)filter_flag_p;
            maskq0 = (LWORD64)filter_flag_q;
            maskp1 = (LWORD64)dep;
            maskq1 = (LWORD64)deq;
            consttc_8x16b = _mm_set1_epi32(tc);

            tmp_delta0_8x16b = _mm_unpacklo_epi8(src_p1_8x16b, src_p0_8x16b);
            tmp_delta1_8x16b = _mm_unpacklo_epi8(src_q0_8x16b, src_q1_8x16b);
            //arranged q31 q30 p30 p31  q21 q20 p20 p21  q1 q10 p10 p11 q01 q00 p00 p01
            tmp_delta1_8x16b = _mm_unpacklo_epi16(tmp_delta0_8x16b, tmp_delta1_8x16b);

            coefdelta_0_8x16b = _mm_load_si128((__m128i *)coef_de1);
            // (-3q1+9q0),(-9p0+3p1)
            tmp_delta0_8x16b = _mm_maddubs_epi16(tmp_delta1_8x16b, coefdelta_0_8x16b);

            //getting -tc store
            tmp2_const_8x16b = _mm_cmpeq_epi32(consttc_8x16b, consttc_8x16b);

            //getting tc in 16 bit
            consttc_8x16b = _mm_packs_epi32(consttc_8x16b, consttc_8x16b);
            //calc 10 *tc = 2*tc +8*tc ; 2*tc
            tmp_pq_str0_8x16b = _mm_slli_epi16(consttc_8x16b, 1);
            //calc 10 *tc = 2*tc +8*tc ; 8*tc
            tmp_pq_str1_8x16b = _mm_slli_epi16(consttc_8x16b, 3);

            //const 1
            const2_8x16b = _mm_srli_epi16(tmp2_const_8x16b, 15);
            //calc 10 *tc
            tmp_pq_str0_8x16b = _mm_add_epi16(tmp_pq_str0_8x16b, tmp_pq_str1_8x16b);
            //delta0 without normalisation and clipping
            tmp_delta0_8x16b = _mm_madd_epi16(tmp_delta0_8x16b, const2_8x16b);

            const2_8x16b = _mm_srli_epi32(tmp2_const_8x16b, 31);

            //loaded coef for delta1 calculation
            coefdelta_0_8x16b = _mm_load_si128((__m128i *)coef_dep1);
            //(-2q1+q0),(p0-2p1)
            tmp_delta1_8x16b = _mm_maddubs_epi16(tmp_delta1_8x16b, coefdelta_0_8x16b);
            //const 8
            const2_8x16b = _mm_slli_epi32(const2_8x16b, 3);

            //normalisation of the filter
            tmp_delta0_8x16b = _mm_add_epi32(tmp_delta0_8x16b, const2_8x16b);
            tmp_delta0_8x16b = _mm_srai_epi32(tmp_delta0_8x16b, 4);

            //getting deltaq0
            tmp_pq_str1_8x16b = _mm_sign_epi32(tmp_delta0_8x16b, tmp2_const_8x16b);
            //getting -tc
            tmp1_const_8x16b = _mm_sign_epi16(consttc_8x16b, tmp2_const_8x16b);
            //packing  d03q d02q d01q d0q d03p d02p d01p d00p
            tmp_delta0_8x16b = _mm_packs_epi32(tmp_delta0_8x16b, tmp_pq_str1_8x16b);
            //absolute delta
            tmp_pq_str1_8x16b = _mm_abs_epi16(tmp_delta0_8x16b);

            //Clipping of delta0
            tmp_delta0_8x16b = _mm_min_epi16(tmp_delta0_8x16b, consttc_8x16b);
            //tc>>1 16 bit
            consttc_8x16b = _mm_srai_epi16(consttc_8x16b, 1);
            //Clipping of delta0
            tmp_delta0_8x16b = _mm_max_epi16(tmp_delta0_8x16b, tmp1_const_8x16b);

            //(-tc)>>1 16 bit
            tmp1_const_8x16b = _mm_sign_epi16(consttc_8x16b, tmp2_const_8x16b);
            //mask for |delta| < 10*tc
            tmp_pq_str0_8x16b = _mm_cmpgt_epi16(tmp_pq_str0_8x16b, tmp_pq_str1_8x16b);
            //delta 1 calc starts

            //getting q32 q22 q12 q02 p32 p12 p22 p02
            tmp0_const_8x16b = _mm_setzero_si128();
            src_q2_8x16b = _mm_unpacklo_epi8(src_q2_8x16b, tmp0_const_8x16b);
            src_p2_8x16b = _mm_unpacklo_epi8(src_p2_8x16b, tmp0_const_8x16b);
            src_p2_8x16b = _mm_unpacklo_epi64(src_p2_8x16b, src_q2_8x16b);
            //constant 1
            const2_8x16b = _mm_srli_epi16(tmp2_const_8x16b, 15);
            //2*delta0
            tmp2_const_8x16b = _mm_add_epi16(tmp_delta0_8x16b, tmp_delta0_8x16b);
            //getting  all respective q's and p's together
            coefdelta_0_8x16b = _mm_load_si128((__m128i *)(shuffle1));
            tmp_delta1_8x16b = _mm_shuffle_epi8(tmp_delta1_8x16b, coefdelta_0_8x16b);
            //final adds for deltap1 and deltaq1
            tmp_delta1_8x16b = _mm_add_epi16(tmp_delta1_8x16b, const2_8x16b);
            src_p2_8x16b = _mm_add_epi16(src_p2_8x16b, tmp2_const_8x16b);
            tmp_delta1_8x16b = _mm_add_epi16(tmp_delta1_8x16b, src_p2_8x16b);
            tmp_delta1_8x16b = _mm_srai_epi16(tmp_delta1_8x16b, 2);

            //mask0= (((LWORD64)filter_flag_q)<<63)| (((LWORD64)filter_flag_p)<<31);
            tmp_pq_str1_8x16b = _mm_loadl_epi64((__m128i *)(&(maskq0)));
            src_p2_8x16b = _mm_loadl_epi64((__m128i *)(&(maskp0)));

            //   src_p2_8x16b = _mm_set_epi32(filter_flag_q,filter_flag_p,filter_flag_q,filter_flag_p);
            //mask1= (((LWORD64)(filter_flag_q&deq))<<63)|(((LWORD64)(filter_flag_p & dep))<<31);
            src_q2_8x16b = _mm_loadl_epi64((__m128i *)(&(maskq1)));
            coefdelta_0_8x16b = _mm_loadl_epi64((__m128i *)(&(maskp1)));

            src_p2_8x16b = _mm_unpacklo_epi32(src_p2_8x16b, tmp_pq_str1_8x16b);
            src_q2_8x16b = _mm_unpacklo_epi32(coefdelta_0_8x16b, src_q2_8x16b);
            //src_q2_8x16b = _mm_set_epi32(deq,dep,deq,dep);
            src_q2_8x16b = _mm_and_si128(src_q2_8x16b, src_p2_8x16b);

            //rearranging the mask values
            src_q2_8x16b = _mm_shuffle_epi32(src_q2_8x16b, 0x50);
            src_p2_8x16b = _mm_shuffle_epi32(src_p2_8x16b, 0x50);

            src_q2_8x16b = _mm_slli_epi32(src_q2_8x16b, 31);
            src_p2_8x16b = _mm_slli_epi32(src_p2_8x16b, 31);
            src_q2_8x16b = _mm_srai_epi32(src_q2_8x16b, 31);
            src_p2_8x16b = _mm_srai_epi32(src_p2_8x16b, 31);

            //combining mask delta1
            tmp_pq_str1_8x16b = _mm_and_si128(tmp_pq_str0_8x16b, src_q2_8x16b);
            // clipping delta1
            tmp_delta1_8x16b = _mm_min_epi16(tmp_delta1_8x16b, consttc_8x16b);
            //combining mask delat0
            tmp_pq_str0_8x16b = _mm_and_si128(tmp_pq_str0_8x16b, src_p2_8x16b);
            // clipping delta1
            tmp_delta1_8x16b = _mm_max_epi16(tmp_delta1_8x16b, tmp1_const_8x16b);


            //masking of the delta values |delta|<10*tc
            tmp_delta1_8x16b = _mm_and_si128(tmp_delta1_8x16b, tmp_pq_str1_8x16b);
            tmp_delta0_8x16b = _mm_and_si128(tmp_delta0_8x16b, tmp_pq_str0_8x16b);
            //separating p and q delta 0 and addinq p0 and q0
            tmp_pq_str0_8x16b = _mm_unpacklo_epi64(tmp_delta0_8x16b, tmp0_const_8x16b);
            tmp_pq_str1_8x16b = _mm_unpackhi_epi64(tmp_delta0_8x16b, tmp0_const_8x16b);
            src_p0_8x16b = _mm_unpacklo_epi8(src_p0_8x16b, tmp0_const_8x16b);
            src_q0_8x16b = _mm_unpacklo_epi8(src_q0_8x16b, tmp0_const_8x16b);
            src_p0_8x16b = _mm_add_epi16(src_p0_8x16b, tmp_pq_str0_8x16b);
            src_q0_8x16b = _mm_add_epi16(src_q0_8x16b, tmp_pq_str1_8x16b);
            //separating p and q delta 0 and addinq p0 and q0
            tmp_pq_str0_8x16b = _mm_unpacklo_epi64(tmp_delta1_8x16b, tmp0_const_8x16b);
            tmp_pq_str1_8x16b = _mm_unpackhi_epi64(tmp_delta1_8x16b, tmp0_const_8x16b);
            src_p1_8x16b = _mm_unpacklo_epi8(src_p1_8x16b, tmp0_const_8x16b);
            src_q1_8x16b = _mm_unpacklo_epi8(src_q1_8x16b, tmp0_const_8x16b);
            src_p1_8x16b = _mm_add_epi16(src_p1_8x16b, tmp_pq_str0_8x16b);
            src_q1_8x16b = _mm_add_epi16(src_q1_8x16b, tmp_pq_str1_8x16b);
            //packing p1 q1 and p0 q0 to 8 bit
            src_p1_8x16b = _mm_packus_epi16(src_p1_8x16b, src_q1_8x16b);
            src_p0_8x16b = _mm_packus_epi16(src_p0_8x16b, src_q0_8x16b);

            src_q1_8x16b = _mm_srli_si128(src_p1_8x16b, 8);
            src_q0_8x16b = _mm_srli_si128(src_p0_8x16b, 8);

            _mm_storel_epi64((__m128i *)(pu1_src - 2 * src_strd), src_p1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src - src_strd), src_p0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src), src_q0_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_src + src_strd), src_q1_8x16b);


        }



    }

}